

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testSampleImages.cpp
# Opt level: O0

void anon_unknown.dwarf_217a65::readImage(char *fileName,uint correctChecksum)

{
  uint16_t uVar1;
  uint16_t uVar2;
  uint16_t uVar3;
  uint16_t uVar4;
  int iVar5;
  ostream *poVar6;
  Rgba *pRVar7;
  long lVar8;
  Array<Imf_3_4::Rgba> *this;
  void *this_00;
  uint in_ESI;
  char *in_RDI;
  int i;
  uint checksum;
  Array<Imf_3_4::Rgba> pixels;
  int dy;
  int dx;
  int h;
  int w;
  Box2i *dw;
  RgbaInputFile in;
  long in_stack_ffffffffffffff28;
  Array<Imf_3_4::Rgba> *in_stack_ffffffffffffff30;
  int local_90;
  uint local_8c;
  Array local_88 [16];
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  int *local_68;
  Rgba local_50 [8];
  uint local_c;
  char *local_8;
  
  local_c = in_ESI;
  local_8 = in_RDI;
  poVar6 = std::operator<<((ostream *)&std::cout,"file ");
  poVar6 = std::operator<<(poVar6,local_8);
  poVar6 = std::operator<<(poVar6," ");
  std::ostream::operator<<(poVar6,std::flush<char,std::char_traits<char>>);
  iVar5 = Imf_3_4::globalThreadCount();
  Imf_3_4::RgbaInputFile::RgbaInputFile((RgbaInputFile *)local_50,local_8,iVar5);
  poVar6 = std::operator<<((ostream *)&std::cout,"version ");
  iVar5 = Imf_3_4::RgbaInputFile::version();
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar5);
  poVar6 = std::operator<<(poVar6," ");
  std::ostream::operator<<(poVar6,std::flush<char,std::char_traits<char>>);
  local_68 = (int *)Imf_3_4::RgbaInputFile::dataWindow();
  local_6c = (local_68[2] - *local_68) + 1;
  local_70 = (local_68[3] - local_68[1]) + 1;
  local_74 = *local_68;
  local_78 = local_68[1];
  Imf_3_4::Array<Imf_3_4::Rgba>::Array(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  pRVar7 = Imf_3_4::Array::operator_cast_to_Rgba_(local_88);
  Imf_3_4::RgbaInputFile::setFrameBuffer
            (local_50,(ulong)(pRVar7 + (-(long)local_74 - (long)(local_78 * local_6c))),1);
  lVar8 = Imf_3_4::RgbaInputFile::dataWindow();
  iVar5 = *(int *)(lVar8 + 4);
  Imf_3_4::RgbaInputFile::dataWindow();
  Imf_3_4::RgbaInputFile::readPixels((int)local_50,iVar5);
  local_8c = 0;
  for (local_90 = 0; local_90 < local_6c * local_70; local_90 = local_90 + 1) {
    pRVar7 = Imf_3_4::Array::operator_cast_to_Rgba_(local_88);
    uVar1 = Imath_3_2::half::bits(&pRVar7[local_90].r);
    pRVar7 = Imf_3_4::Array::operator_cast_to_Rgba_(local_88);
    uVar2 = Imath_3_2::half::bits(&pRVar7[local_90].g);
    pRVar7 = Imf_3_4::Array::operator_cast_to_Rgba_(local_88);
    uVar3 = Imath_3_2::half::bits(&pRVar7[local_90].b);
    pRVar7 = Imf_3_4::Array::operator_cast_to_Rgba_(local_88);
    uVar4 = Imath_3_2::half::bits(&pRVar7[local_90].a);
    local_8c = (uint)uVar4 ^ local_8c ^ uVar1 ^ (uint)uVar2 ^ (uint)uVar3;
  }
  this = (Array<Imf_3_4::Rgba> *)std::operator<<((ostream *)&std::cout,"checksum = ");
  this_00 = (void *)std::ostream::operator<<(this,local_8c);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  if (local_8c == local_c) {
    Imf_3_4::Array<Imf_3_4::Rgba>::~Array(this);
    Imf_3_4::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)local_50);
    return;
  }
  __assert_fail("checksum == correctChecksum",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testSampleImages.cpp"
                ,0x3b,"void (anonymous namespace)::readImage(const char *, unsigned int)");
}

Assistant:

void
readImage (const char fileName[], unsigned int correctChecksum)
{
    cout << "file " << fileName << " " << flush;

    OPENEXR_IMF_NAMESPACE::RgbaInputFile in (fileName);

    cout << "version " << in.version () << " " << flush;

    const Box2i& dw = in.dataWindow ();

    int w  = dw.max.x - dw.min.x + 1;
    int h  = dw.max.y - dw.min.y + 1;
    int dx = dw.min.x;
    int dy = dw.min.y;

    Array<OPENEXR_IMF_NAMESPACE::Rgba> pixels (w * h);
    in.setFrameBuffer (pixels - dx - dy * w, 1, w);
    in.readPixels (in.dataWindow ().min.y, in.dataWindow ().max.y);

    unsigned int checksum = 0;

    for (int i = 0; i < w * h; ++i)
    {
        checksum ^= pixels[i].r.bits ();
        checksum ^= pixels[i].g.bits ();
        checksum ^= pixels[i].b.bits ();
        checksum ^= pixels[i].a.bits ();
    }

    cout << "checksum = " << checksum << endl;

    assert (checksum == correctChecksum);
}